

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

bool __thiscall TgBot::Api::deleteWebhook(Api *this)

{
  type_conflict tVar1;
  bool local_aa;
  allocator local_a9;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_a8;
  ptree local_88;
  string local_60;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  std::__cxx11::string::string((string *)&local_60,"deleteWebhook",&local_a9);
  local_a8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sendRequest(&local_88,this,&local_60,&local_a8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_40,"",0x2e);
  local_aa = false;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(&local_88,&local_40,&local_aa);
  std::__cxx11::string::~string((string *)&local_40);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_88);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_a8);
  std::__cxx11::string::~string((string *)&local_60);
  return tVar1;
}

Assistant:

bool Api::deleteWebhook() const {
    return sendRequest("deleteWebhook").get<bool>("", false);
}